

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  pointer *ppMVar1;
  pointer pLVar2;
  char __c;
  long *plVar3;
  pointer pUVar4;
  pointer pcVar5;
  size_t sVar6;
  pointer pLVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  User *member;
  pointer pUVar13;
  time_t tVar14;
  pointer pCVar15;
  ImGuiIO *pIVar16;
  uint uVar17;
  ulong uVar18;
  vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *this;
  pointer pcVar19;
  char *__s;
  pointer pMVar20;
  User *user_1;
  pointer pUVar21;
  long lVar22;
  User *user;
  value_type *__x;
  uint uVar23;
  bool bVar24;
  vector<Log,_std::allocator<Log>_> logs;
  string text;
  int local_554;
  pointer local_550;
  ulong local_548;
  undefined8 uStack_540;
  vector<Log,_std::allocator<Log>_> local_538;
  long lStack_520;
  undefined1 local_518 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> local_4f8;
  undefined1 local_4e0 [8];
  _Alloc_hider local_4d8;
  undefined1 local_4d0 [24];
  undefined8 local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4b0;
  pointer local_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined1 *local_478;
  undefined8 uStack_470;
  undefined1 local_468 [4];
  undefined4 local_464;
  undefined1 *local_460;
  undefined1 *local_458;
  undefined1 local_450 [8];
  undefined1 local_448 [8];
  undefined8 *local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 local_420;
  undefined8 *puStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 **ppuStack_3f8;
  undefined1 local_3f0;
  undefined4 local_3ec;
  undefined8 *local_3e8 [2];
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 **local_3c8;
  undefined4 local_3c0;
  undefined2 local_3bc;
  undefined8 *local_3b8 [2];
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 *local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  ulong local_378;
  undefined4 *puStack_370;
  undefined8 local_368;
  undefined4 local_360;
  undefined2 local_35c;
  undefined1 *local_358;
  undefined1 *local_350;
  undefined1 local_348 [8];
  undefined1 local_340 [8];
  undefined8 *local_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  uint local_300;
  uint local_2fc;
  undefined1 *local_2f8 [2];
  undefined1 local_2e8 [16];
  undefined1 *local_2d8 [2];
  undefined1 local_2c8 [16];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined1 *local_298;
  undefined8 uStack_290;
  undefined1 local_288 [4];
  undefined4 local_284;
  undefined1 *local_280;
  undefined1 *local_278;
  undefined1 local_270 [8];
  undefined1 local_268 [8];
  undefined8 *local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 *puStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 **ppuStack_218;
  undefined1 local_210;
  undefined4 local_20c;
  undefined8 *local_208 [2];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 **local_1e8;
  undefined4 local_1e0;
  undefined2 local_1dc;
  undefined8 *local_1d8 [2];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 *local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  long local_198;
  undefined4 *puStack_190;
  undefined8 local_188;
  undefined4 local_180;
  undefined2 local_17c;
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 local_168 [8];
  undefined1 local_160 [8];
  undefined8 *local_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined4 local_120;
  undefined4 local_11c;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> local_d8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8;
  undefined4 local_a4;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_4e0 = (undefined1  [8])(((ulong)local_4e0 >> 8 & 0xffffff) << 8);
  local_4d8._M_p = local_4d0 + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"compiler","");
  local_4b8 = aStack_4b0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4b8,"A channel about the compiler","");
  local_464 = 0;
  local_460 = local_450;
  local_498 = 0;
  uStack_490 = 0;
  local_488 = 0;
  uStack_480 = 0;
  local_478 = (undefined1 *)0x0;
  uStack_470 = 0;
  local_468[0] = 0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"random","");
  local_440 = &uStack_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"Random thoughts","");
  local_3ec = 0;
  local_3e8[0] = &local_3d8;
  local_420 = 0;
  puStack_418 = (undefined8 *)0x0;
  local_410 = 0;
  uStack_408 = 0;
  local_400 = 0;
  ppuStack_3f8 = (undefined8 **)0x0;
  local_3f0 = 0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"general","");
  local_3c8 = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3c8,"The main channel about ImTui","");
  local_388 = 0;
  uStack_380 = 0;
  local_398 = (undefined8 *)0x0;
  uStack_390 = 0;
  local_3a8 = 0;
  uStack_3a0 = 0;
  local_378 = CONCAT71(local_378._1_7_,1);
  local_378 = local_378 & 0xffffffff;
  puStack_370 = &local_360;
  std::__cxx11::string::_M_construct<char_const*>((string *)&puStack_370,"rust","");
  local_350 = local_340;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_350,"Tell us how great this language is","");
  local_2fc = 0;
  local_330 = 0;
  uStack_328 = 0;
  local_320 = 0;
  uStack_318 = 0;
  local_310 = 0;
  uStack_308 = 0;
  local_300 = local_300 & 0xffffff00;
  local_2f8[0] = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"c++","");
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"The best language","");
  local_298 = (undefined1 *)0x0;
  uStack_290 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_288[0] = 0;
  local_284 = 2;
  local_280 = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"imtui","");
  local_260 = &uStack_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"The best TUI library","");
  local_20c = 0;
  local_208[0] = &local_1f8;
  local_240 = 0;
  puStack_238 = (undefined8 *)0x0;
  local_230 = 0;
  uStack_228 = 0;
  local_220 = 0;
  ppuStack_218 = (undefined8 **)0x0;
  local_210 = 0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"reddit","");
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"Dive into anything","");
  puStack_190 = &local_180;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1b8 = (undefined8 *)0x0;
  uStack_1b0 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_198 = (ulong)(uint3)((uint)(undefined4)local_198 >> 8) << 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&puStack_190,"hn","");
  local_170 = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Hacker News","");
  local_130 = 0;
  uStack_128 = 0;
  local_140 = 0;
  uStack_138 = 0;
  local_150 = 0;
  uStack_148 = 0;
  local_120 = CONCAT31(local_120._1_3_,1);
  local_11c = 0;
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"news","");
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"Mainstream media news","");
  local_b8 = 0;
  uStack_b0 = 0;
  local_d8.super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_c0 = 0;
  local_d8.super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8 = 0;
  local_a4 = 3;
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"builds","");
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"Build reports","");
  local_40 = 0;
  uStack_38 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_60 = 0;
  uStack_58 = 0;
  std::vector<Channel,std::allocator<Channel>>::_M_assign_aux<Channel_const*>
            ((vector<Channel,std::allocator<Channel>> *)&g_ui.channels,local_4e0);
  lVar22 = 0x4b0;
  do {
    std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::~vector
              ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)
               ((long)&local_4f8.
                       super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar22));
    std::vector<User,_std::allocator<User>_>::~vector
              ((vector<User,_std::allocator<User>_> *)(local_518 + lVar22 + 8));
    plVar3 = *(long **)((long)&local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                               super__Vector_impl_data._M_finish + lVar22);
    if ((long *)((long)&lStack_520 + lVar22) != plVar3) {
      operator_delete(plVar3,*(long *)((long)&lStack_520 + lVar22) + 1);
    }
    if ((long *)((long)&uStack_540 + lVar22) != *(long **)((long)&local_550 + lVar22)) {
      operator_delete(*(long **)((long)&local_550 + lVar22),
                      *(long *)((long)&uStack_540 + lVar22) + 1);
    }
    lVar22 = lVar22 + -0x78;
  } while (lVar22 != 0);
  g_ui.selectedChannel = 2;
  local_4e0._0_6_ = 0x100000000;
  local_4d8._M_p = local_4d0 + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"Georgi Gerganov","");
  local_4b8 = aStack_4b0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"");
  local_498 = 0;
  uStack_490 = 0;
  local_488 = 0;
  uStack_480 = CONCAT26(uStack_480._6_2_,1);
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"John Doe","");
  local_458 = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"");
  local_438 = 0;
  uStack_430 = 0;
  local_428 = 0;
  local_420 = CONCAT26(local_420._6_2_,2);
  puStack_418 = &uStack_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)&puStack_418,"Betty Basil","");
  ppuStack_3f8 = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ppuStack_3f8,"");
  local_3d8 = 0;
  uStack_3d0 = 0;
  local_3c8 = (undefined8 **)0x0;
  local_3c0 = 3;
  local_3bc = 0x101;
  local_3b8[0] = &local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"Chace Jordana","");
  local_398 = &local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"");
  local_378 = 0;
  puStack_370 = (undefined4 *)0x0;
  local_368 = 0;
  local_360 = 4;
  local_35c = 1;
  local_358 = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"Elon Musk","");
  local_338 = &uStack_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"");
  uStack_318 = 0;
  local_310 = 0;
  uStack_308 = 0;
  local_300 = 5;
  local_2fc = local_2fc & 0xffff0000;
  local_2f8[0] = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"Vin Kennedi","");
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"");
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2a8 = 0;
  uStack_2a0 = CONCAT26(uStack_2a0._6_2_,0x100000006);
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Kilie Katlyn","");
  local_278 = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
  local_258 = 0;
  uStack_250 = 0;
  local_248 = 0;
  local_240 = CONCAT26(local_240._6_2_,7);
  puStack_238 = &uStack_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)&puStack_238,"Kaeden Gil","");
  ppuStack_218 = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ppuStack_218,"");
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_1e8 = (undefined8 **)0x0;
  local_1e0 = 8;
  local_1dc = 0;
  local_1d8[0] = &local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Mary Jane","");
  local_1b8 = &local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"");
  local_198 = 0;
  puStack_190 = (undefined4 *)0x0;
  local_188 = 0;
  local_180 = 9;
  local_17c = 0x101;
  local_178 = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"Adair Rigby","");
  local_158 = &uStack_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
  uStack_138 = 0;
  local_130 = 0;
  uStack_128 = 0;
  local_120 = 10;
  local_11c = CONCAT22(local_11c._2_2_,1);
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Bryce Bekki","");
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"");
  local_d8.super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<User,std::allocator<User>>::_M_assign_aux<User_const*>
            ((vector<User,std::allocator<User>> *)&g_ui.users);
  lVar22 = -0x420;
  this = &local_d8;
  do {
    std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::~vector(this);
    pMVar20 = this[-2].super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    ppMVar1 = &this[-1].super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if ((pointer)ppMVar1 != pMVar20) {
      operator_delete(pMVar20,(ulong)((long)&((*ppMVar1)->msg).t_s + 1));
    }
    pMVar20 = this[-3].super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((pointer)(this + -2) != pMVar20) {
      operator_delete(pMVar20,*(long *)&((pointer)(this + -2))->msg + 1);
    }
    pUVar21 = g_ui.users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
              super__Vector_impl_data._M_finish;
    this = this + -4;
    lVar22 = lVar22 + 0x60;
  } while (lVar22 != 0);
  g_ui.selectedUser = -1;
  pCVar15 = (pointer)kLogs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                     super__Vector_impl_data._M_start;
  for (__x = g_ui.users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
             super__Vector_impl_data._M_start;
      kLogs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)pCVar15, __x != pUVar21; __x = __x + 1) {
    iVar8 = rand();
    uVar17 = (uint)((ulong)(long)iVar8 %
                   (ulong)(((long)g_ui.channels.
                                  super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)g_ui.channels.
                                  super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 3) * -0x1111111111111111));
    if (uVar17 < 0x7fffffff) {
      iVar8 = 0;
LAB_0011e535:
      do {
        iVar9 = rand();
        iVar9 = (int)((ulong)(long)iVar9 %
                     (ulong)(((long)g_ui.channels.
                                    super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)g_ui.channels.
                                    super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 3) * -0x1111111111111111));
        pUVar13 = g_ui.channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar9].members.
                  super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        pUVar4 = g_ui.channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar9].members.
                 super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        if (pUVar13 != pUVar4) {
          do {
            if (pUVar13->id == __x->id) goto LAB_0011e535;
            pUVar13 = pUVar13 + 1;
          } while (pUVar13 != pUVar4);
        }
        std::vector<User,_std::allocator<User>_>::push_back
                  (&g_ui.channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar9].members,__x);
        iVar8 = iVar8 + 1;
      } while (iVar8 < (int)(uVar17 + 1));
    }
    pCVar15 = (pointer)kLogs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                       super__Vector_impl_data._M_start;
  }
  local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (pCVar15 !=
      (pointer)kLogs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.super__Vector_impl_data.
               _M_finish) {
    local_550 = (pointer)kLogs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    do {
      local_518._0_8_ = &local_508;
      local_518._8_8_ = (char *)0x0;
      local_508._M_local_buf[0] = '\0';
      pcVar5 = (pCVar15->description)._M_dataplus._M_p;
      if (pcVar5 != (pointer)0x0) {
        lVar22 = *(long *)((long)&(pCVar15->label).field_2 + 8);
        pcVar19 = (pointer)0x0;
        do {
          __c = pcVar19[lVar22];
          __s = "@";
          if (__c < ' ') {
LAB_0011e611:
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_518,__s);
          }
          else {
            if (__c == '&') {
              __s = "@amp;";
              goto LAB_0011e611;
            }
            __s = "@lt;";
            if (__c == '<') goto LAB_0011e611;
            if (__c == '>') {
              __s = "@gt;";
              goto LAB_0011e611;
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_518
                      ,__c);
          }
          pcVar19 = pcVar19 + 1;
        } while (pcVar5 != pcVar19);
      }
      pcVar5 = (((string *)&pCVar15->hasUnread)->_M_dataplus)._M_p;
      local_4e0 = (undefined1  [8])local_4d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4e0,pcVar5,(pCVar15->label)._M_dataplus._M_p + (long)pcVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._0_8_ == &local_508) {
        aStack_4b0._8_8_ = local_508._8_8_;
        local_4d0._16_8_ = &aStack_4b0;
      }
      else {
        local_4d0._16_8_ = local_518._0_8_;
      }
      aStack_4b0._M_allocated_capacity._1_7_ = local_508._M_allocated_capacity._1_7_;
      aStack_4b0._M_local_buf[0] = local_508._M_local_buf[0];
      local_4b8 = (char *)local_518._8_8_;
      local_518._8_8_ = 0;
      local_508._M_local_buf[0] = '\0';
      local_518._0_8_ = &local_508;
      std::vector<Log,_std::allocator<Log>_>::emplace_back<Log>(&local_538,(Log *)local_4e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._16_8_ != &aStack_4b0) {
        operator_delete((void *)local_4d0._16_8_,aStack_4b0._M_allocated_capacity + 1);
      }
      if (local_4e0 != (undefined1  [8])local_4d0) {
        operator_delete((void *)local_4e0,local_4d0._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._0_8_ != &local_508) {
        operator_delete((void *)local_518._0_8_,
                        CONCAT71(local_508._M_allocated_capacity._1_7_,local_508._M_local_buf[0]) +
                        1);
      }
      pCVar15 = (pointer)((pCVar15->description).field_2._M_local_buf + 8);
    } while (pCVar15 != local_550);
  }
  local_550 = g_ui.channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_4f8.super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)g_ui.channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                super__Vector_impl_data._M_finish;
  if (g_ui.channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
      super__Vector_impl_data._M_start !=
      g_ui.channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      tVar14 = time((time_t *)0x0);
      iVar8 = rand();
      iVar9 = rand();
      pLVar7 = local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pLVar2 = local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar10 = rand();
      uVar17 = iVar10 % 100;
      local_548 = (ulong)uVar17;
      if (-10 < (int)uVar17) {
        pMVar20 = (pointer)0x0;
        uVar23 = (int)((ulong)(long)iVar9 % (((long)pLVar7 - (long)pLVar2 >> 6) - 2U)) + 1;
        iVar8 = (int)tVar14 +
                (iVar8 + ((uint)((ulong)((long)iVar8 * 0x51eb851f) >> 0x25) - (iVar8 >> 0x1f)) *
                         -100) * -0x15180 + -0xd2f00;
        local_4f8.super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)&local_550->messages;
        local_548 = (ulong)(uVar17 + 9);
        local_554 = -1;
        do {
          sVar6 = local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)(int)uVar23 + -1].username._M_string_length
          ;
          uStack_540._4_4_ = iVar8;
          local_4f8.super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = pMVar20;
          if (sVar6 == local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar23].username._M_string_length) {
            if (sVar6 == 0) {
              bVar24 = true;
            }
            else {
              iVar8 = bcmp((local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                            super__Vector_impl_data._M_start + (int)uVar23)[-1].username._M_dataplus
                           ._M_p,local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                 super__Vector_impl_data._M_start[(int)uVar23].username._M_dataplus.
                                 _M_p,sVar6);
              bVar24 = iVar8 == 0;
            }
            if ((local_554 == -1) || (iVar8 = 0x3c, !bVar24)) goto LAB_0011e877;
          }
          else {
            bVar24 = false;
LAB_0011e877:
            iVar8 = rand();
            iVar9 = (int)((ulong)(long)iVar8 %
                         (ulong)(((long)g_ui.users.super__Vector_base<User,_std::allocator<User>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)g_ui.users.super__Vector_base<User,_std::allocator<User>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 5) *
                                -0x5555555555555555));
            if (!bVar24) {
              while (local_554 == iVar9) {
                iVar8 = rand();
                iVar9 = (int)((ulong)(long)iVar8 %
                             (ulong)(((long)g_ui.users.
                                            super__Vector_base<User,_std::allocator<User>_>._M_impl.
                                            super__Vector_impl_data._M_finish -
                                      (long)g_ui.users.
                                            super__Vector_base<User,_std::allocator<User>_>._M_impl.
                                            super__Vector_impl_data._M_start >> 5) *
                                    -0x5555555555555555));
              }
            }
            iVar8 = 0xe10;
            local_554 = iVar9;
            if (bVar24) {
              iVar8 = 0x3c;
            }
          }
          iVar11 = rand();
          iVar12 = rand();
          iVar9 = 0;
          iVar10 = 0;
          if (0x50 < iVar12 % 100) {
            iVar10 = rand();
            iVar10 = iVar10 % 5;
          }
          iVar12 = rand();
          if (0x5a < iVar12 % 100) {
            iVar9 = rand();
            iVar9 = iVar9 % 5;
          }
          pLVar2 = local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                   super__Vector_impl_data._M_start + (int)uVar23;
          sVar6 = local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)(int)uVar23 + 1].username._M_string_length;
          if (sVar6 == local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar23].username._M_string_length) {
            if (sVar6 == 0) {
              iVar10 = 0;
              iVar9 = 0;
            }
            else {
              iVar12 = bcmp(pLVar2[1].username._M_dataplus._M_p,(pLVar2->username)._M_dataplus._M_p,
                            sVar6);
              if (iVar12 == 0) {
                iVar9 = 0;
                iVar10 = 0;
              }
            }
          }
          iVar8 = iVar11 % iVar8 + uStack_540._4_4_;
          local_4e0._4_4_ = local_554;
          local_4e0._0_4_ = iVar8;
          local_4d8._M_p = local_4d0 + 8;
          pcVar5 = (pLVar2->text)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4d8,pcVar5,pcVar5 + (pLVar2->text)._M_string_length);
          local_4b8 = (char *)CONCAT44(iVar9,iVar10);
          aStack_4b0._M_allocated_capacity = 0;
          aStack_4b0._8_8_ = 0;
          local_4a0 = (pointer)0x0;
          std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::
          emplace_back<MessageWithReplies>
                    ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)
                     local_4f8.
                     super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(MessageWithReplies *)local_4e0);
          std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::~vector
                    ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)&aStack_4b0)
          ;
          pcVar5 = local_4d0 + 8;
          if (local_4d8._M_p != pcVar5) {
            operator_delete(local_4d8._M_p,local_4d0._8_8_ + 1);
          }
          iVar9 = rand();
          if (0x5a < iVar9 % 100) {
            iVar9 = rand();
            iVar9 = iVar9 % 0x1e;
            if (0 < iVar9) {
              do {
                iVar10 = rand();
                uVar23 = (uint)((ulong)(long)(int)(uVar23 + 1) %
                               (((long)local_538.super__Vector_base<Log,_std::allocator<Log>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_538.super__Vector_base<Log,_std::allocator<Log>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 6) - 1U));
                if ((int)uVar23 < 2) {
                  uVar23 = 1;
                }
                iVar11 = rand();
                if (0x50 < iVar11 % 100) {
                  rand();
                }
                iVar11 = rand();
                if (0x5a < iVar11 % 100) {
                  rand();
                }
                iVar8 = iVar8 + iVar10 % 0x3c;
                pMVar20 = (local_550->messages).
                          super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                local_4e0._0_4_ = iVar8;
                iVar10 = rand();
                local_4e0._4_4_ =
                     (int)((ulong)(long)iVar10 %
                          (ulong)(((long)g_ui.users.super__Vector_base<User,_std::allocator<User>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                   (long)g_ui.users.super__Vector_base<User,_std::allocator<User>_>.
                                         _M_impl.super__Vector_impl_data._M_start >> 5) *
                                 -0x5555555555555555));
                pcVar19 = local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar23].text._M_dataplus._M_p;
                local_4d8._M_p = pcVar5;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4d8,pcVar19,
                           pcVar19 + local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl
                                     .super__Vector_impl_data._M_start[uVar23].text._M_string_length
                          );
                aStack_4b0._8_8_ = 0;
                local_4a0 = (pointer)0x0;
                local_4b8 = (char *)0x0;
                aStack_4b0._M_allocated_capacity = 0;
                std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::
                emplace_back<MessageWithReplies>
                          (&pMVar20[-1].replies,(MessageWithReplies *)local_4e0);
                std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::~vector
                          ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)
                           &aStack_4b0);
                if (local_4d8._M_p != pcVar5) {
                  operator_delete(local_4d8._M_p,local_4d0._8_8_ + 1);
                }
                iVar9 = iVar9 + -1;
              } while (iVar9 != 0);
            }
          }
          uVar23 = (uint)((ulong)(long)(int)(uVar23 + 1) %
                         (((long)local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 6) - 1U));
          if ((int)uVar23 < 2) {
            uVar23 = 1;
          }
          pMVar20 = (pointer)(ulong)((int)local_4f8.
                                          super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        } while ((int)local_4f8.
                      super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage != (int)local_548);
      }
      local_550 = local_550 + 1;
    } while (local_550 !=
             (pointer)local_4f8.
                      super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  }
  local_4f8.super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)g_ui.users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                super__Vector_impl_data._M_finish;
  pUVar21 = g_ui.users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (g_ui.users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      g_ui.users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      if (pUVar21->id != 0) {
        tVar14 = time((time_t *)0x0);
        iVar8 = rand();
        iVar9 = rand();
        pLVar7 = local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pLVar2 = local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar10 = rand();
        uVar17 = iVar10 % 100;
        local_548 = (ulong)uVar17;
        if (-10 < (int)uVar17) {
          pMVar20 = (pointer)0x0;
          iVar9 = (int)((ulong)(long)iVar9 % (((long)pLVar7 - (long)pLVar2 >> 6) - 2U)) + 1;
          iVar10 = (int)tVar14 +
                   (iVar8 + ((uint)((ulong)((long)iVar8 * 0x51eb851f) >> 0x25) - (iVar8 >> 0x1f)) *
                            -100) * -0x15180 + -0xd2f00;
          local_4f8.super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)&pUVar21->messages;
          local_548 = (ulong)(uVar17 + 9);
          iVar8 = -1;
          do {
            pCVar15 = (pointer)(long)iVar9;
            sVar6 = local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [(long)((long)&pCVar15[-1].messages.
                                   super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)].username
                    ._M_string_length;
            local_550 = pCVar15;
            local_4f8.super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = pMVar20;
            if (sVar6 == local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                         super__Vector_impl_data._M_start[(long)pCVar15].username._M_string_length)
            {
              if (sVar6 == 0) {
                bVar24 = true;
              }
              else {
                iVar9 = bcmp((local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                              super__Vector_impl_data._M_start + (long)pCVar15)[-1].username.
                             _M_dataplus._M_p,
                             local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                             super__Vector_impl_data._M_start[(long)pCVar15].username._M_dataplus.
                             _M_p,sVar6);
                bVar24 = iVar9 == 0;
              }
              if ((iVar8 == -1) || (iVar9 = 0x3c, iVar11 = iVar8, !bVar24)) goto LAB_0011edfc;
            }
            else {
              bVar24 = false;
LAB_0011edfc:
              iVar9 = rand();
              uVar18 = (ulong)(long)iVar9 %
                       (ulong)(((long)g_ui.users.super__Vector_base<User,_std::allocator<User>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)g_ui.users.super__Vector_base<User,_std::allocator<User>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 5) *
                              -0x5555555555555555);
              iVar9 = 0x3c;
              iVar11 = (int)uVar18;
              if (!bVar24) {
                while ((iVar11 = (int)uVar18, iVar11 == iVar8 ||
                       ((iVar9 = 0xe10, iVar11 != 0 && (iVar11 != pUVar21->id))))) {
                  iVar9 = rand();
                  uVar18 = (ulong)(long)iVar9 %
                           (ulong)(((long)g_ui.users.super__Vector_base<User,_std::allocator<User>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)g_ui.users.super__Vector_base<User,_std::allocator<User>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5) *
                                  -0x5555555555555555);
                }
              }
            }
            uStack_540._4_4_ = rand();
            uStack_540._4_4_ = uStack_540._4_4_ % iVar9;
            iVar12 = rand();
            iVar8 = 0;
            iVar9 = 0;
            if (0x50 < iVar12 % 100) {
              iVar9 = rand();
              iVar9 = iVar9 % 5;
            }
            iVar12 = rand();
            if (0x5a < iVar12 % 100) {
              iVar8 = rand();
              iVar8 = iVar8 % 5;
            }
            local_550 = (pointer)&local_550->field_0x1;
            pLVar2 = local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                     super__Vector_impl_data._M_start + (long)pCVar15;
            sVar6 = local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)local_550].username._M_string_length;
            if (sVar6 == local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                         super__Vector_impl_data._M_start[(long)pCVar15].username._M_string_length)
            {
              if (sVar6 == 0) {
                iVar9 = 0;
                iVar8 = 0;
              }
              else {
                iVar12 = bcmp(local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                              super__Vector_impl_data._M_start[(long)local_550].username._M_dataplus
                              ._M_p,(pLVar2->username)._M_dataplus._M_p,sVar6);
                if (iVar12 == 0) {
                  iVar8 = 0;
                  iVar9 = 0;
                }
              }
            }
            iVar10 = iVar10 + uStack_540._4_4_;
            local_4e0._4_4_ = iVar11;
            local_4e0._0_4_ = iVar10;
            local_4d8._M_p = local_4d0 + 8;
            pcVar5 = (pLVar2->text)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4d8,pcVar5,pcVar5 + (pLVar2->text)._M_string_length);
            local_4b8 = (char *)CONCAT44(iVar8,iVar9);
            aStack_4b0._M_allocated_capacity = 0;
            aStack_4b0._8_8_ = 0;
            local_4a0 = (pointer)0x0;
            std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::
            emplace_back<MessageWithReplies>
                      ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)
                       local_4f8.
                       super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(MessageWithReplies *)local_4e0);
            std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::~vector
                      ((vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *)
                       &aStack_4b0);
            if (local_4d8._M_p != local_4d0 + 8) {
              operator_delete(local_4d8._M_p,local_4d0._8_8_ + 1);
            }
            iVar9 = (int)((ulong)local_550 %
                         (((long)local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_538.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 6) - 1U));
            if (iVar9 < 2) {
              iVar9 = 1;
            }
            pMVar20 = (pointer)(ulong)((int)local_4f8.
                                            super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            iVar8 = iVar11;
          } while ((int)local_4f8.
                        super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage != (int)local_548);
        }
      }
      pUVar21 = pUVar21 + 1;
    } while (pUVar21 !=
             (pointer)local_4f8.
                      super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<Log,_std::allocator<Log>_>::~vector(&local_538);
  ImGui::DebugCheckVersionAndDataLayout("1.81",0x1558,0x414,8,0x10,0x14,2);
  ImGui::CreateContext((ImFontAtlas *)0x0);
  UI::setStyle(&g_ui,EStyle_Dark);
  pIVar16 = ImGui::GetIO();
  pIVar16->IniFilename = (char *)0x0;
  g_screen = ImTui_ImplNcurses_Init(true,60.0,3.0);
  ImTui_ImplText_Init();
  if (g_isRunning == true) {
    do {
      render_frame();
    } while (g_isRunning != false);
  }
  ImTui_ImplText_Shutdown();
  ImTui_ImplNcurses_Shutdown();
  return 0;
}

Assistant:

int main() {
    // initialize some random workspace data
    {
        // channels
        {
            g_ui.channels = {
                { false, 0, "compiler", "A channel about the compiler",       {}, {} },
                { false, 0, "random",   "Random thoughts",                    {}, {} },
                { false, 0, "general",  "The main channel about ImTui",       {}, {} },
                { true,  0, "rust",     "Tell us how great this language is", {}, {} },
                { false, 0, "c++",      "The best language",                  {}, {} },
                { false, 2, "imtui",    "The best TUI library",               {}, {} },
                { false, 0, "reddit",   "Dive into anything",                 {}, {} },
                { false, 0, "hn",       "Hacker News",                        {}, {} },
                { true,  0, "news",     "Mainstream media news",              {}, {} },
                { false, 3, "builds",   "Build reports",                      {}, {} },
            };

            g_ui.selectedChannel = 2;
        }

        // users
        {
            g_ui.users = {
                {  0, true , false, "Georgi Gerganov", "", {}},
                {  1, false, false, "John Doe",        "", {}},
                {  2, false, false, "Betty Basil",     "", {}},
                {  3, true , true,  "Chace Jordana",   "", {}},
                {  4, true , false, "Elon Musk",       "", {}},
                {  5, false, false, "Vin Kennedi",     "", {}},
                {  6, true , false, "Kilie Katlyn",    "", {}},
                {  7, false, false, "Kaeden Gil",      "", {}},
                {  8, false, false, "Mary Jane",       "", {}},
                {  9, true , true,  "Adair Rigby",     "", {}},
                { 10, true , false, "Bryce Bekki",     "", {}},
            };

            g_ui.selectedUser = -1;

            // assign users to random set of channels
            for (auto & user : g_ui.users) {
                const int nMembership = rand()%g_ui.channels.size() + 1;

                for (int i = 0; i < nMembership; i++) {
                    int channelIndex = rand()%g_ui.channels.size();
                    while (g_ui.channels[channelIndex].isMember(user.id)) {
                        channelIndex = rand()%g_ui.channels.size();
                    }
                    g_ui.channels[channelIndex].members.push_back(user);
                }
            }
        }

        // filter the logs, because we only support single-byte strings
        std::vector<Log> logs;
        for (auto & cur : kLogs) {
            std::string text;
            for (auto & ch : cur.text) {
                if (ch < 32) {
                    text += "@";
                } else if (ch == '<') {
                    text += "@lt;";
                } else if (ch == '>') {
                    text += "@gt;";
                } else if (ch == '&') {
                    text += "@amp;";
                } else {
                    text += ch;
                }
            }

            logs.push_back({ cur.username, std::move(text) });
        }

        // generate random channel messages
        for (auto & channel : g_ui.channels) {
            auto t = tGet() - 24*3600*(rand()%100 + 10);

            int lastUid = -1;
            int logId = 1 + rand()%(logs.size() - 2);
            const int nMessages = rand()%100 + 10;

            for (int i = 0; i < nMessages; ++i) {
                const bool isSameUser = (logs[logId - 1].username == logs[logId].username);

                int uid = lastUid == -1 || !isSameUser ? rand()%g_ui.users.size() : lastUid;
                while (!isSameUser && uid == lastUid) {
                    uid = rand()%g_ui.users.size();
                }
                lastUid = uid;

                if (isSameUser) {
                    t += rand()%60;
                } else {
                    t += rand()%3600;
                }

                int nReactUp   = rand()%100 > 80 ? rand()%5 : 0;
                int nReactDown = rand()%100 > 90 ? rand()%5 : 0;

                if (logs[logId + 1].username == logs[logId].username) {
                    nReactUp = 0;
                    nReactDown = 0;
                }

                channel.messages.push_back({ {
                    t, uid, logs[logId].text, nReactUp, nReactDown, }, {}
                });

                // random threads
                const int nReplies = rand()%100 > 90 ? rand()%30 : 0;
                for (int j = 0; j < nReplies; ++j) {
                    t += rand()%60;
                    logId = std::max((int)((logId + 1)%(logs.size() - 1)), 1);

                    nReactUp   = rand()%100 > 80 ? rand()%5 : 0;
                    nReactDown = rand()%100 > 90 ? rand()%5 : 0;

                    channel.messages.back().replies.push_back({ {
                        t, (int) (rand()%g_ui.users.size()), logs[logId].text, 0, 0,
                    }, {} });
                }

                logId = std::max((int)((logId + 1)%(logs.size() - 1)), 1);
            }
        }

        // generate random DMs
        for (auto & user : g_ui.users) {
            if (user.id == 0) continue;

            auto t = tGet() - 24*3600*(rand()%100 + 10);

            int lastUid = -1;
            int logId = 1 + rand()%(logs.size() - 2);
            const int nMessages = rand()%100 + 10;

            for (int i = 0; i < nMessages; ++i) {
                const bool isSameUser = (logs[logId - 1].username == logs[logId].username);

                int uid = lastUid == -1 || !isSameUser ? rand()%g_ui.users.size() : lastUid;
                while (!isSameUser && (uid == lastUid || (uid != 0 && uid != user.id))) {
                    uid = rand()%g_ui.users.size();
                }
                lastUid = uid;

                if (isSameUser) {
                    t += rand()%60;
                } else {
                    t += rand()%3600;
                }

                int nReactUp   = rand()%100 > 80 ? rand()%5 : 0;
                int nReactDown = rand()%100 > 90 ? rand()%5 : 0;

                if (logs[logId + 1].username == logs[logId].username) {
                    nReactUp = 0;
                    nReactDown = 0;
                }

                user.messages.push_back({ {
                    t, uid, logs[logId].text, nReactUp, nReactDown, }, {}
                });

                logId = std::max((int)((logId + 1)%(logs.size() - 1)), 1);
            }
        }
    }

    IMGUI_CHECKVERSION();
    ImGui::CreateContext();

    g_ui.setStyle(UI::EStyle_Dark);

    ImGui::GetIO().IniFilename = nullptr;

#ifdef __EMSCRIPTEN__
    g_screen = ImTui_ImplEmscripten_Init(true);
#else
    // when no changes occured - limit frame rate to 3.0 fps to save CPU
    g_screen = ImTui_ImplNcurses_Init(true, 60.0, 3.0);
#endif

    ImTui_ImplText_Init();

#ifndef __EMSCRIPTEN__
    while (g_isRunning) {
        if (render_frame() == false) break;
    }

    ImTui_ImplText_Shutdown();
    ImTui_ImplNcurses_Shutdown();
#endif

    return 0;
}